

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdLocal.c
# Opt level: O3

DdNode * Extra_dsdRemap(DdManager *dd,DdNode *bF,st__table *pCache,int *pVar2Form,int *pForm2Var,
                       DdNode **pbCube0,DdNode **pbCube1)

{
  st__table *bF_00;
  DdNode *n;
  int *pForm2Var_00;
  int iVar1;
  uint uVar2;
  DdNode *n_00;
  uint *puVar3;
  long lVar4;
  DdNode *local_60;
  st__table *local_58;
  DdNode *local_50;
  DdNode **local_48;
  long local_40;
  int *local_38;
  
  puVar3 = (uint *)((ulong)bF & 0xfffffffffffffffe);
  uVar2 = *puVar3;
  if (uVar2 != 0x7fffffff) {
    local_48 = pbCube0;
    local_38 = pForm2Var;
    if (puVar3[1] != 1) {
      iVar1 = st__lookup(pCache,(char *)bF,(char **)&local_60);
      if (iVar1 != 0) {
        return local_60;
      }
      uVar2 = *puVar3;
    }
    lVar4 = (long)pVar2Form[uVar2];
    local_40 = lVar4;
    local_50 = Extra_bddNodePointedByCube(dd,bF,local_48[lVar4]);
    local_58 = (st__table *)Extra_bddNodePointedByCube(dd,bF,pbCube1[lVar4]);
    pForm2Var_00 = local_38;
    local_50 = Extra_dsdRemap(dd,local_50,pCache,pVar2Form,local_38,local_48,pbCube1);
    Cudd_Ref(local_50);
    bF_00 = local_58;
    local_58 = pCache;
    n_00 = Extra_dsdRemap(dd,(DdNode *)bF_00,pCache,pVar2Form,pForm2Var_00,local_48,pbCube1);
    Cudd_Ref(n_00);
    n = local_50;
    local_60 = Cudd_bddIte(dd,dd->vars[pForm2Var_00[local_40]],n_00,local_50);
    Cudd_Ref(local_60);
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,n_00);
    if (puVar3[1] != 1) {
      st__insert(local_58,(char *)bF,(char *)local_60);
    }
    Cudd_Deref(local_60);
    bF = local_60;
  }
  return bF;
}

Assistant:

DdNode * Extra_dsdRemap( DdManager * dd, DdNode * bF, st__table * pCache,
    int * pVar2Form, int * pForm2Var, DdNode * pbCube0[], DdNode * pbCube1[] )
{
    DdNode * bFR, * bF0, * bF1;
    DdNode * bRes0, * bRes1, * bRes;
    int iForm;
    
    bFR = Cudd_Regular(bF);
    if ( cuddIsConstant(bFR) )
        return bF;

    // check the hash-table
    if ( bFR->ref != 1 )
    {
        if ( st__lookup( pCache, (char *)bF, (char **)&bRes ) )
            return bRes;
    }

    // get the formal input
    iForm = pVar2Form[bFR->index];

    // get the nodes pointed to by the cube
    bF0 = Extra_bddNodePointedByCube( dd, bF, pbCube0[iForm] );
    bF1 = Extra_bddNodePointedByCube( dd, bF, pbCube1[iForm] );

    // call recursively for these nodes
    bRes0 = Extra_dsdRemap( dd, bF0, pCache, pVar2Form, pForm2Var, pbCube0, pbCube1 ); Cudd_Ref( bRes0 );
    bRes1 = Extra_dsdRemap( dd, bF1, pCache, pVar2Form, pForm2Var, pbCube0, pbCube1 ); Cudd_Ref( bRes1 );

    // derive the result using ITE
    bRes = Cudd_bddIte( dd, dd->vars[ pForm2Var[iForm] ], bRes1, bRes0 ); Cudd_Ref( bRes );
    Cudd_RecursiveDeref( dd, bRes0 );
    Cudd_RecursiveDeref( dd, bRes1 );

    // add to the hash table
    if ( bFR->ref != 1 )
        st__insert( pCache, (char *)bF, (char *)bRes );
    Cudd_Deref( bRes );
    return bRes;
}